

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  UdpEdgeFieldSyntax *pUVar1;
  Token *in_stack_00000010;
  Token *in_stack_00000018;
  Token *in_stack_00000020;
  Token *in_stack_00000028;
  BumpAllocator *in_stack_00000030;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pUVar1 = BumpAllocator::
           emplace<slang::syntax::UdpEdgeFieldSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                      in_stack_00000010);
  return (int)pUVar1;
}

Assistant:

static SyntaxNode* clone(const UdpEdgeFieldSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<UdpEdgeFieldSyntax>(
        node.openParen.deepClone(alloc),
        node.first.deepClone(alloc),
        node.second.deepClone(alloc),
        node.closeParen.deepClone(alloc)
    );
}